

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O0

Json __thiscall jsonrpcpp::Batch::to_json_abi_cxx11_(Batch *this)

{
  bool bVar1;
  element_type *peVar2;
  json_value extraout_RDX;
  long in_RSI;
  Json JVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  __shared_ptr_access<jsonrpcpp::Entity,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_40;
  shared_ptr<jsonrpcpp::Entity> *j;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<jsonrpcpp::Entity>,_std::allocator<std::shared_ptr<jsonrpcpp::Entity>_>_>
  *__range1;
  Batch *this_local;
  Json *result;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this,(nullptr_t)0x0);
  __end1 = std::
           vector<std::shared_ptr<jsonrpcpp::Entity>,_std::allocator<std::shared_ptr<jsonrpcpp::Entity>_>_>
           ::begin((vector<std::shared_ptr<jsonrpcpp::Entity>,_std::allocator<std::shared_ptr<jsonrpcpp::Entity>_>_>
                    *)(in_RSI + 0x10));
  j = (shared_ptr<jsonrpcpp::Entity> *)
      std::
      vector<std::shared_ptr<jsonrpcpp::Entity>,_std::allocator<std::shared_ptr<jsonrpcpp::Entity>_>_>
      ::end((vector<std::shared_ptr<jsonrpcpp::Entity>,_std::allocator<std::shared_ptr<jsonrpcpp::Entity>_>_>
             *)(in_RSI + 0x10));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<jsonrpcpp::Entity>_*,_std::vector<std::shared_ptr<jsonrpcpp::Entity>,_std::allocator<std::shared_ptr<jsonrpcpp::Entity>_>_>_>
                                     *)&j), bVar1) {
    local_40 = (__shared_ptr_access<jsonrpcpp::Entity,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<jsonrpcpp::Entity>_*,_std::vector<std::shared_ptr<jsonrpcpp::Entity>,_std::allocator<std::shared_ptr<jsonrpcpp::Entity>_>_>_>
               ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<jsonrpcpp::Entity,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_40);
    (*peVar2->_vptr_Entity[3])(&local_50);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)this,&local_50);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_50);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<jsonrpcpp::Entity>_*,_std::vector<std::shared_ptr<jsonrpcpp::Entity>,_std::allocator<std::shared_ptr<jsonrpcpp::Entity>_>_>_>
    ::operator++(&__end1);
  }
  JVar3.m_value.object = extraout_RDX.object;
  JVar3._0_8_ = this;
  return JVar3;
}

Assistant:

inline Json Batch::to_json() const
{
    Json result;
    for (const auto& j : entities)
        result.push_back(j->to_json());
    return result;
}